

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

char llbuild::buildsystem::BuildKey::identifierForKind(Kind kind)

{
  code *pcVar1;
  char local_9;
  Kind kind_local;
  
  switch(kind) {
  case Command:
    local_9 = 'C';
    break;
  case CustomTask:
    local_9 = 'X';
    break;
  case DirectoryContents:
    local_9 = 'D';
    break;
  case FilteredDirectoryContents:
    local_9 = 'd';
    break;
  case DirectoryTreeSignature:
    local_9 = 'S';
    break;
  case DirectoryTreeStructureSignature:
    local_9 = 's';
    break;
  case Node:
    local_9 = 'N';
    break;
  case Stat:
    local_9 = 'I';
    break;
  case Target:
    local_9 = 'T';
    break;
  case Unknown:
    local_9 = ' ';
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_9;
}

Assistant:

static char identifierForKind(Kind kind) {
    switch (kind) {
    case Kind::Command: return 'C';
    case Kind::DirectoryContents: return 'D';
    case Kind::FilteredDirectoryContents: return 'd';
    case Kind::Node: return 'N';
    case Kind::Stat: return 'I';
    case Kind::DirectoryTreeSignature: return 'S';
    case Kind::DirectoryTreeStructureSignature: return 's';
    case Kind::Target: return 'T';
    case Kind::CustomTask: return 'X';
    case Kind::Unknown: return ' ';
    }
  }